

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
AnalyzeVariableDefinition
          (ExpressionContext *ctx,SynVariableDefinition *syntax,uint alignment,TypeBase *type)

{
  Allocator *allocator;
  ScopeData *scope;
  TypeStruct *pTVar1;
  VariableData *pVVar2;
  char *pcVar3;
  FunctionData *function;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  undefined4 extraout_var;
  SynIdentifier *name;
  undefined4 extraout_var_01;
  TypeFunction *type_00;
  undefined4 extraout_var_02;
  ExprError *pEVar8;
  SynBase *pSVar9;
  undefined4 extraout_var_03;
  TypeBase *pTVar10;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  _func_int **pp_Var11;
  ExprGetAddress *pEVar12;
  ExprBase *pEVar13;
  undefined4 extraout_var_07;
  TypeRef *pTVar14;
  VariableHandle *pVVar15;
  ExprZeroInitialize *this_00;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  char *pcVar16;
  char *in_R8;
  ExprDereference *node;
  ExprGetAddress *pEVar17;
  InplaceStr name_00;
  InplaceStr IVar18;
  FunctionValue bestOverload;
  IntrusiveList<MatchData> aliases;
  VariableData *this;
  undefined4 extraout_var_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_08;
  
  if (syntax->name == (SynIdentifier *)0x0) {
LAB_0016570c:
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar13 = (ExprBase *)CONCAT44(extraout_var_01,iVar6);
    pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar13->typeID = 0;
    pEVar13->source = &syntax->super_SynBase;
    pEVar13->type = pTVar10;
    pEVar13->next = (ExprBase *)0x0;
    pEVar13->listed = false;
    pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00223b38;
    pEVar13[2]._vptr_ExprBase = (_func_int **)0x0;
    pEVar13[1]._vptr_ExprBase = (_func_int **)&pEVar13[1].source;
    *(undefined8 *)&pEVar13[1].typeID = 0x400000000;
    return pEVar13;
  }
  bestOverload.source = (SynBase *)0x1ee4c4;
  bestOverload.function = (FunctionData *)0x1ee4c8;
  bVar4 = InplaceStr::operator==(&syntax->name->name,(InplaceStr *)&bestOverload);
  if (bVar4) {
    anon_unknown.dwarf_9c70f::Stop
              (ctx,&syntax->super_SynBase,"ERROR: \'this\' is a reserved keyword");
  }
  if ((type != (TypeBase *)0x0) && (type->typeID == 0)) {
    if ((syntax->initializer != (SynBase *)0x0) && (ctx->scope->ownerType == (TypeBase *)0x0)) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_04,iVar6);
      pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pSVar9 = (SynBase *)AnalyzeExpression(ctx,syntax->initializer);
      pEVar13->typeID = 0;
      pEVar13->source = &syntax->super_SynBase;
      pEVar13->type = pTVar10;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00223b38;
      pEVar13[2]._vptr_ExprBase = (_func_int **)0x0;
      pEVar13[1]._vptr_ExprBase = (_func_int **)&pEVar13[1].source;
      *(undefined8 *)&pEVar13[1].typeID = 0x400000001;
      pEVar13[1].source = pSVar9;
      return pEVar13;
    }
    goto LAB_0016570c;
  }
  IVar18 = GetVariableNameInScope(ctx,ctx->scope,syntax->name->name);
  name_00.end = in_R8;
  name_00.begin = IVar18.end;
  bVar4 = anon_unknown.dwarf_9c70f::CheckVariableConflict
                    ((anon_unknown_dwarf_9c70f *)ctx,(ExpressionContext *)syntax,
                     (SynBase *)IVar18.begin,name_00);
  iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x170);
  this = (VariableData *)CONCAT44(extraout_var,iVar6);
  allocator = ctx->allocator;
  scope = ctx->scope;
  iVar6 = (*allocator->_vptr_Allocator[2])(allocator,0x50);
  name = (SynIdentifier *)CONCAT44(extraout_var_00,iVar6);
  SynBase::SynBase((SynBase *)name,4,(syntax->name->super_SynBase).begin,
                   (syntax->name->super_SynBase).end);
  (name->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002222c0;
  name->name = IVar18;
  uVar7 = ctx->uniqueVariableId;
  ctx->uniqueVariableId = uVar7 + 1;
  VariableData::VariableData(this,allocator,&syntax->super_SynBase,scope,0,type,name,0,uVar7);
  bVar5 = anon_unknown.dwarf_9c70f::IsLookupOnlyVariable((ExpressionContext *)ctx->scope,this);
  if (bVar5) {
    this->lookupOnly = true;
  }
  if (!bVar4) {
    ExpressionContext::AddVariable(ctx,this,true);
  }
  if ((syntax->initializer == (SynBase *)0x0) || (this->scope->ownerType != (TypeBase *)0x0)) {
    pSVar9 = (SynBase *)0x0;
  }
  else {
    pSVar9 = (SynBase *)AnalyzeExpression(ctx,syntax->initializer);
  }
  if (ctx->typeAuto == type) {
    if (this->scope->ownerType != (TypeBase *)0x0) {
      pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pEVar8 = anon_unknown.dwarf_9c70f::ReportExpected
                         (ctx,&syntax->super_SynBase,pTVar10,
                          "ERROR: member variable type cannot be \'auto\'");
      return &pEVar8->super_ExprBase;
    }
    pSVar9 = (SynBase *)ResolveInitializerValue(ctx,&syntax->super_SynBase,(ExprBase *)pSVar9);
    type_00 = (TypeFunction *)pSVar9->end;
    if (type_00 == (TypeFunction *)0x0) {
      type_00 = (TypeFunction *)0x0;
    }
    else if ((type_00->super_TypeBase).typeID == 0) goto LAB_00165913;
  }
  else if (pSVar9 == (SynBase *)0x0 || type->isGeneric != true) {
    type_00 = (TypeFunction *)type;
    if (type->isGeneric != false) {
      if (this->scope->ownerType != (TypeBase *)0x0) {
        pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEVar8 = anon_unknown.dwarf_9c70f::ReportExpected
                           (ctx,&syntax->super_SynBase,pTVar10,
                            "ERROR: member variable type cannot be \'%.*s\'",
                            (ulong)(uint)(*(int *)&(type->name).end - (int)(type->name).begin));
        return &pEVar8->super_ExprBase;
      }
      uVar7 = *(int *)&(type->name).end - (int)(type->name).begin;
      pcVar16 = "ERROR: initializer is required to resolve generic type \'%.*s\'";
      goto LAB_00165f8a;
    }
  }
  else {
    pTVar10 = (TypeBase *)pSVar9->end;
    if ((pTVar10 != (TypeBase *)0x0) && (pTVar10->typeID == 0)) {
LAB_00165913:
      if (!bVar4) {
        DirectChainedMap<IdentifierLookupResult>::remove
                  (&ctx->scope->idLookupMap,(char *)(ulong)this->nameHash);
      }
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_03,iVar6);
      pTVar10 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      pEVar13->typeID = 0;
      pEVar13->source = &syntax->super_SynBase;
      pEVar13->type = pTVar10;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00223b38;
      pEVar13[2]._vptr_ExprBase = (_func_int **)0x0;
      pEVar13[1]._vptr_ExprBase = (_func_int **)&pEVar13[1].source;
      *(undefined8 *)&pEVar13[1].typeID = 0x400000001;
      pEVar13[1].source = pSVar9;
      return pEVar13;
    }
    aliases.head = (MatchData *)0x0;
    aliases.tail = (MatchData *)0x0;
    type_00 = (TypeFunction *)
              MatchGenericType(ctx,&syntax->super_SynBase,type,pTVar10,&aliases,true);
    if ((type_00 == (TypeFunction *)0x0) || ((type_00->super_TypeBase).isGeneric != false)) {
      pcVar16 = (((TypeBase *)pSVar9->end)->name).begin;
      pcVar3 = (type->name).begin;
      anon_unknown.dwarf_9c70f::Stop
                (ctx,&syntax->super_SynBase,
                 "ERROR: can\'t resolve generic type \'%.*s\' instance for \'%.*s\'",
                 (ulong)(uint)(*(int *)&(((TypeBase *)pSVar9->end)->name).end - (int)pcVar16),
                 pcVar16,(ulong)(uint)(*(int *)&(type->name).end - (int)pcVar3),pcVar3);
    }
    if (((((type_00->super_TypeBase).typeID == 0x15) && (type_00->returnType != (TypeBase *)0x0)) &&
        (type_00->returnType->typeID == 0xe)) &&
       (GetFunctionForType(&bestOverload,ctx,(SynBase *)pSVar9->begin,(ExprBase *)pSVar9,type_00),
       function = bestOverload.function, bestOverload.function != (FunctionData *)0x0)) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pSVar9 = (SynBase *)CONCAT44(extraout_var_02,iVar6);
      ExprFunctionAccess::ExprFunctionAccess
                ((ExprFunctionAccess *)pSVar9,bestOverload.source,&function->type->super_TypeBase,
                 function,bestOverload.context);
      type_00 = function->type;
    }
  }
  if ((alignment == 0) &&
     (((pTVar10 = ctx->scope->ownerType, pTVar10 == (TypeBase *)0x0 ||
       (alignment = pTVar10->alignment, alignment == 0)) ||
      ((type_00->super_TypeBase).alignment <= alignment)))) {
    alignment = (type_00->super_TypeBase).alignment;
  }
  uVar7 = anon_unknown.dwarf_9c70f::AllocateVariableInScope
                    (ctx,&syntax->super_SynBase,alignment,&type_00->super_TypeBase);
  this->type = &type_00->super_TypeBase;
  this->alignment = alignment;
  this->offset = uVar7;
  if (((type_00 == (TypeFunction *)0x0) || ((type_00->super_TypeBase).typeID != 0x18)) ||
     (*(char *)((long)&type_00[2].super_TypeBase.size + 2) != '\x01')) {
    if (this->scope->ownerType != (TypeBase *)0x0) {
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar13 = (ExprBase *)CONCAT44(extraout_var_05,iVar6);
      pTVar10 = ctx->typeVoid;
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var11 = (_func_int **)CONCAT44(extraout_var_06,iVar6);
      *pp_Var11 = (_func_int *)syntax->name;
      pp_Var11[1] = (_func_int *)this;
      pp_Var11[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var11 + 3) = 0;
      pEVar13->typeID = 0x1e;
      pEVar13->source = &syntax->super_SynBase;
      pEVar13->type = pTVar10;
      pEVar13->next = (ExprBase *)0x0;
      pEVar13->listed = false;
      pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
      pEVar13[1]._vptr_ExprBase = pp_Var11;
      *(undefined8 *)&pEVar13[1].typeID = 0;
      return pEVar13;
    }
    if (pSVar9 == (SynBase *)0x0) {
      bVar4 = HasDefaultConstructor(ctx,&syntax->super_SynBase,&type_00->super_TypeBase);
      if (bVar4) {
        pEVar13 = CreateVariableAccess(ctx,&syntax->name->super_SynBase,this,true);
        pTVar10 = this->type;
        pEVar13 = CreateGetAddress(ctx,&syntax->super_SynBase,pEVar13);
        this_00 = (ExprZeroInitialize *)
                  CreateDefaultConstructorCall(ctx,&syntax->super_SynBase,pTVar10,pEVar13);
      }
      else if (((ctx->scope == ctx->globalScope) ||
               (ctx->scope->ownerNamespace != (NamespaceData *)0x0)) || (this->type->size == 0)) {
        this_00 = (ExprZeroInitialize *)0x0;
      }
      else {
        pEVar12 = (ExprGetAddress *)CreateVariableAccess(ctx,&syntax->name->super_SynBase,this,true)
        ;
        if (pEVar12 == (ExprGetAddress *)0x0) {
          pEVar17 = (ExprGetAddress *)0x0;
        }
        else {
          uVar7 = (pEVar12->super_ExprBase).typeID;
          if (uVar7 == 0x16) {
            pEVar17 = (ExprGetAddress *)pEVar12->variable;
          }
          else {
            pEVar17 = pEVar12;
            if (uVar7 == 0x22) {
              iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar17 = (ExprGetAddress *)CONCAT44(extraout_var_11,iVar6);
              pSVar9 = (pEVar12->super_ExprBase).source;
              pTVar14 = ExpressionContext::GetReferenceType(ctx,(pEVar12->super_ExprBase).type);
              iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pVVar15 = (VariableHandle *)CONCAT44(extraout_var_12,iVar6);
              pVVar2 = (VariableData *)pEVar12->variable;
              pVVar15->source = (pEVar12->super_ExprBase).source;
              pVVar15->variable = pVVar2;
              pVVar15->next = (VariableHandle *)0x0;
              pVVar15->listed = false;
              ExprGetAddress::ExprGetAddress(pEVar17,pSVar9,&pTVar14->super_TypeBase,pVVar15);
            }
          }
        }
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        this_00 = (ExprZeroInitialize *)CONCAT44(extraout_var_14,iVar6);
        ExprZeroInitialize::ExprZeroInitialize
                  (this_00,syntax->initializer,ctx->typeVoid,&pEVar17->super_ExprBase);
      }
    }
    else {
      if (((TypeBase *)pSVar9->end != (TypeBase *)0x0) && (((TypeBase *)pSVar9->end)->typeID == 0))
      {
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar13 = (ExprBase *)CONCAT44(extraout_var_09,iVar6);
        pTVar10 = ctx->typeVoid;
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
        pp_Var11 = (_func_int **)CONCAT44(extraout_var_10,iVar6);
        *pp_Var11 = (_func_int *)syntax->name;
        pp_Var11[1] = (_func_int *)this;
        pp_Var11[2] = (_func_int *)0x0;
        *(undefined1 *)(pp_Var11 + 3) = 0;
        pEVar13->typeID = 0x1e;
        pEVar13->source = &syntax->super_SynBase;
        pEVar13->type = pTVar10;
        pEVar13->next = (ExprBase *)0x0;
        pEVar13->listed = false;
        pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
        pEVar13[1]._vptr_ExprBase = pp_Var11;
        *(SynBase **)&pEVar13[1].typeID = pSVar9;
        return pEVar13;
      }
      pEVar12 = (ExprGetAddress *)CreateVariableAccess(ctx,&syntax->name->super_SynBase,this,true);
      pTVar10 = this->type;
      if ((((pTVar10 == (TypeBase *)0x0) || (pTVar10->typeID != 0x13)) ||
          ((pTVar1 = (TypeStruct *)pSVar9->end, pTVar1 != (TypeStruct *)0x0 &&
           ((pTVar1->super_TypeBase).typeID == 0x13)))) ||
         ((pTVar1 == ctx->typeAutoArray || (pTVar1 == ctx->typeAutoRef)))) {
        this_00 = (ExprZeroInitialize *)
                  CreateAssignment(ctx,syntax->initializer,(ExprBase *)pEVar12,(ExprBase *)pSVar9);
      }
      else {
        pEVar13 = CreateCast(ctx,syntax->initializer,(ExprBase *)pSVar9,
                             (TypeBase *)pTVar10[1]._vptr_TypeBase,false);
        if (pEVar12 == (ExprGetAddress *)0x0) {
          pEVar17 = (ExprGetAddress *)0x0;
        }
        else {
          uVar7 = (pEVar12->super_ExprBase).typeID;
          if (uVar7 == 0x16) {
            pEVar17 = (ExprGetAddress *)pEVar12->variable;
          }
          else {
            pEVar17 = pEVar12;
            if (uVar7 == 0x22) {
              iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
              pEVar17 = (ExprGetAddress *)CONCAT44(extraout_var_07,iVar6);
              pSVar9 = (pEVar12->super_ExprBase).source;
              pTVar14 = ExpressionContext::GetReferenceType(ctx,(pEVar12->super_ExprBase).type);
              iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              pVVar15 = (VariableHandle *)CONCAT44(extraout_var_08,iVar6);
              pVVar2 = (VariableData *)pEVar12->variable;
              pVVar15->source = (pEVar12->super_ExprBase).source;
              pVVar15->variable = pVVar2;
              pVVar15->next = (VariableHandle *)0x0;
              pVVar15->listed = false;
              ExprGetAddress::ExprGetAddress(pEVar17,pSVar9,&pTVar14->super_TypeBase,pVVar15);
            }
          }
        }
        iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        this_00 = (ExprZeroInitialize *)CONCAT44(extraout_var_13,iVar6);
        pSVar9 = syntax->initializer;
        pTVar10 = ctx->typeVoid;
        (this_00->super_ExprBase).typeID = 0x20;
        (this_00->super_ExprBase).source = pSVar9;
        (this_00->super_ExprBase).type = pTVar10;
        (this_00->super_ExprBase).next = (ExprBase *)0x0;
        (this_00->super_ExprBase).listed = false;
        (this_00->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223fd0;
        this_00->address = &pEVar17->super_ExprBase;
        this_00[1].super_ExprBase._vptr_ExprBase = (_func_int **)pEVar13;
      }
    }
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    pEVar13 = (ExprBase *)CONCAT44(extraout_var_15,iVar6);
    pTVar10 = ctx->typeVoid;
    iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
    pp_Var11 = (_func_int **)CONCAT44(extraout_var_16,iVar6);
    *pp_Var11 = (_func_int *)syntax->name;
    pp_Var11[1] = (_func_int *)this;
    pp_Var11[2] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var11 + 3) = 0;
    pEVar13->typeID = 0x1e;
    pEVar13->source = &syntax->super_SynBase;
    pEVar13->type = pTVar10;
    pEVar13->next = (ExprBase *)0x0;
    pEVar13->listed = false;
    pEVar13->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
    pEVar13[1]._vptr_ExprBase = pp_Var11;
    *(ExprZeroInitialize **)&pEVar13[1].typeID = this_00;
    return pEVar13;
  }
  uVar7 = *(int *)&(type_00->super_TypeBase).name.end - (int)(type_00->super_TypeBase).name.begin;
  pcVar16 = "ERROR: cannot create \'%.*s\' that implements \'finalize\' on stack";
LAB_00165f8a:
  anon_unknown.dwarf_9c70f::Stop(ctx,&syntax->super_SynBase,pcVar16,(ulong)uVar7);
}

Assistant:

ExprBase* AnalyzeVariableDefinition(ExpressionContext &ctx, SynVariableDefinition *syntax, unsigned alignment, TypeBase *type)
{
	if(!syntax->name)
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());

	if(syntax->name->name == InplaceStr("this"))
		Stop(ctx, syntax, "ERROR: 'this' is a reserved keyword");

	if(isType<TypeError>(type))
	{
		if(syntax->initializer && !ctx.scope->ownerType)
			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), AnalyzeExpression(ctx, syntax->initializer));

		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());
	}

	InplaceStr fullName = GetVariableNameInScope(ctx, ctx.scope, syntax->name->name);

	bool conflict = CheckVariableConflict(ctx, syntax, fullName);

	VariableData *variable = new (ctx.get<VariableData>()) VariableData(ctx.allocator, syntax, ctx.scope, 0, type, new (ctx.get<SynIdentifier>()) SynIdentifier(syntax->name, fullName), 0, ctx.uniqueVariableId++);

	if (IsLookupOnlyVariable(ctx, variable))
		variable->lookupOnly = true;

	if(!conflict)
		ctx.AddVariable(variable, true);

	ExprBase *initializer = syntax->initializer && !variable->scope->ownerType ? AnalyzeExpression(ctx, syntax->initializer) : NULL;

	if(type == ctx.typeAuto)
	{
		if(variable->scope->ownerType)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: member variable type cannot be 'auto'");

		initializer = ResolveInitializerValue(ctx, syntax, initializer);

		if(isType<TypeError>(initializer->type))
		{
			if(!conflict)
				ctx.scope->idLookupMap.remove(variable->nameHash, IdentifierLookupResult(variable));

			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), initializer);
		}

		type = initializer->type;
	}
	else if(type->isGeneric && initializer)
	{
		if(isType<TypeError>(initializer->type))
		{
			if(!conflict)
				ctx.scope->idLookupMap.remove(variable->nameHash, IdentifierLookupResult(variable));

			return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType(), initializer);
		}

		IntrusiveList<MatchData> aliases;

		TypeBase *match = MatchGenericType(ctx, syntax, type, initializer->type, aliases, true);

		if(!match || match->isGeneric)
			Stop(ctx, syntax, "ERROR: can't resolve generic type '%.*s' instance for '%.*s'", FMT_ISTR(initializer->type->name), FMT_ISTR(type->name));

		// If initiallizer is a generic function and the matched function type return type is unknown, we have to instantiate the function here to find the actual return type
		if(TypeFunction *target = getType<TypeFunction>(match))
		{
			if(isType<TypeAuto>(target->returnType))
			{
				if(FunctionValue bestOverload = GetFunctionForType(ctx, initializer->source, initializer, target))
				{
					initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);

					match = bestOverload.function->type;
				}
			}
		}

		type = match;
	}
	else if(type->isGeneric)
	{
		if(variable->scope->ownerType)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: member variable type cannot be '%.*s'", FMT_ISTR(type->name));

		Stop(ctx, syntax, "ERROR: initializer is required to resolve generic type '%.*s'", FMT_ISTR(type->name));
	}

	if(alignment == 0)
	{
		TypeBase *parentType = ctx.scope->ownerType;

		if(parentType && parentType->alignment != 0 && parentType->alignment < type->alignment)
			alignment = parentType->alignment;
		else
			alignment = type->alignment;
	}

	// Fixup variable data not that the final type is known
	unsigned offset = AllocateVariableInScope(ctx, syntax, alignment, type);
	
	variable->type = type;
	variable->alignment = alignment;
	variable->offset = offset;

	if(TypeClass *classType = getType<TypeClass>(variable->type))
	{
		if(classType->hasFinalizer)
			Stop(ctx, syntax, "ERROR: cannot create '%.*s' that implements 'finalize' on stack", FMT_ISTR(classType->name));
	}

	if(variable->scope->ownerType)
		return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), NULL);

	if(initializer)
	{
		if(isType<TypeError>(initializer->type))
			return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), initializer);

		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		TypeArray *arrType = getType<TypeArray>(variable->type);

		// Single-level array might be set with a single element at the point of definition
		if(arrType && !isType<TypeArray>(initializer->type) && initializer->type != ctx.typeAutoArray && initializer->type != ctx.typeAutoRef)
		{
			initializer = CreateCast(ctx, syntax->initializer, initializer, arrType->subType, false);

			if(ExprVariableAccess *node = getType<ExprVariableAccess>(access))
				access = new (ctx.get<ExprGetAddress>()) ExprGetAddress(access->source, ctx.GetReferenceType(access->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
			else if(ExprDereference *node = getType<ExprDereference>(access))
				access = node->value;

			initializer = new (ctx.get<ExprArraySetup>()) ExprArraySetup(syntax->initializer, ctx.typeVoid, access, initializer);
		}
		else
		{
			initializer = CreateAssignment(ctx, syntax->initializer, access, initializer);
		}
	}
	else if(HasDefaultConstructor(ctx, syntax, variable->type))
	{
		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		if(ExprBase *call = CreateDefaultConstructorCall(ctx, syntax, variable->type, CreateGetAddress(ctx, syntax, access)))
			initializer = call;
	}
	else if(ctx.scope != ctx.globalScope && ctx.scope->ownerNamespace == NULL && variable->type->size != 0)
	{
		ExprBase *access = CreateVariableAccess(ctx, syntax->name, variable, true);

		if(ExprVariableAccess *node = getType<ExprVariableAccess>(access))
			access = new (ctx.get<ExprGetAddress>()) ExprGetAddress(access->source, ctx.GetReferenceType(access->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
		else if(ExprDereference *node = getType<ExprDereference>(access))
			access = node->value;

		initializer = new (ctx.get<ExprZeroInitialize>()) ExprZeroInitialize(syntax->initializer, ctx.typeVoid, access);
	}

	return new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(syntax, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(syntax->name, variable), initializer);
}